

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# x86assembler.cpp
# Opt level: O0

Error __thiscall asmjit::v1_14::x86::Assembler::onAttach(Assembler *this,CodeHolder *code)

{
  undefined1 *in_RSI;
  CodeHolder *in_RDI;
  Error _err;
  Arch arch;
  undefined4 in_stack_ffffffffffffff88;
  undefined3 in_stack_ffffffffffffff8c;
  undefined4 uVar1;
  byte bVar2;
  Error local_60;
  
  uVar1 = CONCAT13(*in_RSI,in_stack_ffffffffffffff8c);
  local_60 = BaseAssembler::onAttach
                       ((BaseAssembler *)CONCAT44(uVar1,in_stack_ffffffffffffff88),in_RDI);
  bVar2 = (byte)((uint)uVar1 >> 0x18);
  if (local_60 == 0) {
    in_RDI->field_0xa = 1;
    assignEmitterFuncs((BaseEmitter *)in_RDI);
    if ((bVar2 & 1) == 1) {
      *(uint *)&in_RDI->field_0x24 = *(uint *)&in_RDI->field_0x24 | 0x80000000;
      *(undefined4 *)&in_RDI->_baseAddress = 0x40;
    }
    else {
      *(uint *)&in_RDI->field_0x24 = *(uint *)&in_RDI->field_0x24 & 0x7fffffff;
      *(undefined4 *)&in_RDI->_baseAddress = 0x80;
    }
    local_60 = 0;
  }
  return local_60;
}

Assistant:

Error Assembler::onAttach(CodeHolder* code) noexcept {
  Arch arch = code->arch();
  ASMJIT_PROPAGATE(Base::onAttach(code));

  _instructionAlignment = uint8_t(1);
  assignEmitterFuncs(this);

  if (Environment::is32Bit(arch)) {
    // 32 bit architecture - X86.
    _forcedInstOptions |= InstOptions::kX86_InvalidRex;
    _setAddressOverrideMask(kX86MemInfo_67H_X86);
  }
  else {
    // 64 bit architecture - X64.
    _forcedInstOptions &= ~InstOptions::kX86_InvalidRex;
    _setAddressOverrideMask(kX86MemInfo_67H_X64);
  }

  return kErrorOk;
}